

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

void vrna_params_subst(vrna_fold_compound_t *vc,vrna_param_t *parameters)

{
  vrna_param_t *pvVar1;
  vrna_param_t *parameters_local;
  vrna_fold_compound_t *vc_local;
  
  if (vc != (vrna_fold_compound_t *)0x0) {
    if (vc->params != (vrna_param_t *)0x0) {
      free(vc->params);
    }
    if (parameters == (vrna_param_t *)0x0) {
      if (vc->type < 2) {
        pvVar1 = vrna_params((vrna_md_t *)0x0);
        vc->params = pvVar1;
      }
    }
    else {
      pvVar1 = vrna_params_copy(parameters);
      vc->params = pvVar1;
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_params_subst(vrna_fold_compound_t  *vc,
                  vrna_param_t          *parameters)
{
  if (vc) {
    if (vc->params)
      free(vc->params);

    if (parameters) {
      vc->params = vrna_params_copy(parameters);
    } else {
      switch (vc->type) {
        case VRNA_FC_TYPE_SINGLE:     /* fall through */

        case VRNA_FC_TYPE_COMPARATIVE:
          vc->params = vrna_params(NULL);
          break;

        default:
          break;
      }
    }
  }
}